

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

bool __thiscall wasm::I64ToI32Lowering::handleUnreachable(I64ToI32Lowering *this,Expression *curr)

{
  ulong uVar1;
  Expression **ppEVar2;
  Block *expression;
  ulong extraout_RDX;
  bool bVar3;
  AbstractChildIterator<wasm::ChildIterator> *pAVar4;
  Iterator IVar5;
  optional<wasm::Type> type;
  AbstractChildIterator<wasm::ChildIterator> local_b0;
  AbstractChildIterator<wasm::ChildIterator> *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> children;
  Index local_48;
  Drop *local_40;
  Expression *child;
  
  if ((curr->type).id == 1) {
    auStack_68 = (undefined1  [8])0x0;
    children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    child = (Expression *)this;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_b0,curr);
    local_48 = 0;
    children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_b0;
    IVar5 = AbstractChildIterator<wasm::ChildIterator>::end(&local_b0);
    local_70 = IVar5.parent;
    bVar3 = false;
    pAVar4 = &local_b0;
    while ((local_48 != IVar5.index || (pAVar4 != local_70))) {
      ppEVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                          ((Iterator *)
                           &children.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_40 = (Drop *)*ppEVar2;
      uVar1 = (local_40->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.
              id;
      if (uVar1 < 2) {
        bVar3 = (bool)(bVar3 | uVar1 == 1);
      }
      else {
        local_40 = Builder::makeDrop(*(Builder **)(child + 0x13),(Expression *)local_40);
      }
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_68,
                 (value_type *)&local_40);
      local_48 = local_48 + 1;
      pAVar4 = (AbstractChildIterator<wasm::ChildIterator> *)
               children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              (&local_b0.children.flexible.
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>);
    if (bVar3) {
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX
      ;
      expression = Builder::
                   makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                             (*(Builder **)(child + 0x13),
                              (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                              auStack_68,type);
      if ((expression->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id
          != 1) {
        __assert_fail("block->type == Type::unreachable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x689,"bool wasm::I64ToI32Lowering::handleUnreachable(Expression *)");
      }
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                ((Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_> *)
                 &child[5].type,(Expression *)expression);
    }
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_68);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool handleUnreachable(Expression* curr) {
    if (curr->type != Type::unreachable) {
      return false;
    }
    std::vector<Expression*> children;
    bool hasUnreachable = false;
    for (auto* child : ChildIterator(curr)) {
      if (child->type.isConcrete()) {
        child = builder->makeDrop(child);
      } else if (child->type == Type::unreachable) {
        hasUnreachable = true;
      }
      children.push_back(child);
    }
    if (!hasUnreachable) {
      return false;
    }
    // This has an unreachable child, so we can replace it with
    // the children.
    auto* block = builder->makeBlock(children);
    assert(block->type == Type::unreachable);
    replaceCurrent(block);
    return true;
  }